

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_pass_resp(Curl_easy *data,int pop3code,pop3state instate)

{
  CURLcode local_1c;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  Curl_easy *data_local;
  
  local_1c = CURLE_OK;
  if (pop3code == 0x2b) {
    pop3_state(data,POP3_STOP);
  }
  else {
    Curl_failf(data,"Access denied. %c",(ulong)(uint)pop3code);
    local_1c = CURLE_LOGIN_DENIED;
  }
  return local_1c;
}

Assistant:

static CURLcode pop3_state_pass_resp(struct Curl_easy *data, int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied. %c", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else
    /* End of connect phase */
    pop3_state(data, POP3_STOP);

  return result;
}